

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_d;
  TextureSaver local_c;
  
  if ((this->m_isRepeated != repeated) && (this->m_isRepeated = repeated, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_d);
    priv::TextureSaver::TextureSaver(&local_c);
    if (setRepeated(bool)::textureEdgeClamp == '\0') {
      iVar1 = __cxa_guard_acquire(&setRepeated(bool)::textureEdgeClamp);
      if (iVar1 != 0) {
        setRepeated::textureEdgeClamp =
             sfogl_ext_EXT_texture_edge_clamp != 0 || sfogl_ext_SGIS_texture_edge_clamp != 0;
        __cxa_guard_release(&setRepeated(bool)::textureEdgeClamp);
      }
    }
    if (((this->m_isRepeated == false) && (setRepeated::textureEdgeClamp == false)) &&
       (setRepeated(bool)::warned == '\0')) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"OpenGL extension SGIS_texture_edge_clamp unavailable");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Artifacts may occur along texture edges");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available");
      std::endl<char,std::char_traits<char>>(poVar2);
      setRepeated(bool)::warned = '\x01';
    }
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a6,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    uVar3 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      uVar3 = 0x812f;
    }
    uVar4 = 0x2901;
    if (this->m_isRepeated == false) {
      uVar4 = uVar3;
    }
    glTexParameteri(0xde1,0x2802,uVar4);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a7,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    uVar3 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      uVar3 = 0x812f;
    }
    uVar4 = 0x2901;
    if (this->m_isRepeated == false) {
      uVar4 = uVar3;
    }
    glTexParameteri(0xde1,0x2803,uVar4);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a8,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    priv::TextureSaver::~TextureSaver(&local_c);
    GlResource::TransientContextLock::~TransientContextLock(&local_d);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}